

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftpproto.c
# Opt level: O2

void do_site_chmod(session_t *sess,char *chmod_arg)

{
  uint __mode;
  int iVar1;
  char *text;
  char file [100];
  char perms [100];
  
  if (*chmod_arg != '\0') {
    perms[0x50] = '\0';
    perms[0x51] = '\0';
    perms[0x52] = '\0';
    perms[0x53] = '\0';
    perms[0x54] = '\0';
    perms[0x55] = '\0';
    perms[0x56] = '\0';
    perms[0x57] = '\0';
    perms[0x58] = '\0';
    perms[0x59] = '\0';
    perms[0x5a] = '\0';
    perms[0x5b] = '\0';
    perms[0x5c] = '\0';
    perms[0x5d] = '\0';
    perms[0x5e] = '\0';
    perms[0x5f] = '\0';
    perms[0x40] = '\0';
    perms[0x41] = '\0';
    perms[0x42] = '\0';
    perms[0x43] = '\0';
    perms[0x44] = '\0';
    perms[0x45] = '\0';
    perms[0x46] = '\0';
    perms[0x47] = '\0';
    perms[0x48] = '\0';
    perms[0x49] = '\0';
    perms[0x4a] = '\0';
    perms[0x4b] = '\0';
    perms[0x4c] = '\0';
    perms[0x4d] = '\0';
    perms[0x4e] = '\0';
    perms[0x4f] = '\0';
    perms[0x30] = '\0';
    perms[0x31] = '\0';
    perms[0x32] = '\0';
    perms[0x33] = '\0';
    perms[0x34] = '\0';
    perms[0x35] = '\0';
    perms[0x36] = '\0';
    perms[0x37] = '\0';
    perms[0x38] = '\0';
    perms[0x39] = '\0';
    perms[0x3a] = '\0';
    perms[0x3b] = '\0';
    perms[0x3c] = '\0';
    perms[0x3d] = '\0';
    perms[0x3e] = '\0';
    perms[0x3f] = '\0';
    perms[0x20] = '\0';
    perms[0x21] = '\0';
    perms[0x22] = '\0';
    perms[0x23] = '\0';
    perms[0x24] = '\0';
    perms[0x25] = '\0';
    perms[0x26] = '\0';
    perms[0x27] = '\0';
    perms[0x28] = '\0';
    perms[0x29] = '\0';
    perms[0x2a] = '\0';
    perms[0x2b] = '\0';
    perms[0x2c] = '\0';
    perms[0x2d] = '\0';
    perms[0x2e] = '\0';
    perms[0x2f] = '\0';
    perms[0x60] = '\0';
    perms[0x61] = '\0';
    perms[0x62] = '\0';
    perms[99] = '\0';
    perms[0x10] = '\0';
    perms[0x11] = '\0';
    perms[0x12] = '\0';
    perms[0x13] = '\0';
    perms[0x14] = '\0';
    perms[0x15] = '\0';
    perms[0x16] = '\0';
    perms[0x17] = '\0';
    perms[0x18] = '\0';
    perms[0x19] = '\0';
    perms[0x1a] = '\0';
    perms[0x1b] = '\0';
    perms[0x1c] = '\0';
    perms[0x1d] = '\0';
    perms[0x1e] = '\0';
    perms[0x1f] = '\0';
    perms[0] = '\0';
    perms[1] = '\0';
    perms[2] = '\0';
    perms[3] = '\0';
    perms[4] = '\0';
    perms[5] = '\0';
    perms[6] = '\0';
    perms[7] = '\0';
    perms[8] = '\0';
    perms[9] = '\0';
    perms[10] = '\0';
    perms[0xb] = '\0';
    perms[0xc] = '\0';
    perms[0xd] = '\0';
    perms[0xe] = '\0';
    perms[0xf] = '\0';
    file[0x50] = '\0';
    file[0x51] = '\0';
    file[0x52] = '\0';
    file[0x53] = '\0';
    file[0x54] = '\0';
    file[0x55] = '\0';
    file[0x56] = '\0';
    file[0x57] = '\0';
    file[0x58] = '\0';
    file[0x59] = '\0';
    file[0x5a] = '\0';
    file[0x5b] = '\0';
    file[0x5c] = '\0';
    file[0x5d] = '\0';
    file[0x5e] = '\0';
    file[0x5f] = '\0';
    file[0x40] = '\0';
    file[0x41] = '\0';
    file[0x42] = '\0';
    file[0x43] = '\0';
    file[0x44] = '\0';
    file[0x45] = '\0';
    file[0x46] = '\0';
    file[0x47] = '\0';
    file[0x48] = '\0';
    file[0x49] = '\0';
    file[0x4a] = '\0';
    file[0x4b] = '\0';
    file[0x4c] = '\0';
    file[0x4d] = '\0';
    file[0x4e] = '\0';
    file[0x4f] = '\0';
    file[0x30] = '\0';
    file[0x31] = '\0';
    file[0x32] = '\0';
    file[0x33] = '\0';
    file[0x34] = '\0';
    file[0x35] = '\0';
    file[0x36] = '\0';
    file[0x37] = '\0';
    file[0x38] = '\0';
    file[0x39] = '\0';
    file[0x3a] = '\0';
    file[0x3b] = '\0';
    file[0x3c] = '\0';
    file[0x3d] = '\0';
    file[0x3e] = '\0';
    file[0x3f] = '\0';
    file[0x20] = '\0';
    file[0x21] = '\0';
    file[0x22] = '\0';
    file[0x23] = '\0';
    file[0x24] = '\0';
    file[0x25] = '\0';
    file[0x26] = '\0';
    file[0x27] = '\0';
    file[0x28] = '\0';
    file[0x29] = '\0';
    file[0x2a] = '\0';
    file[0x2b] = '\0';
    file[0x2c] = '\0';
    file[0x2d] = '\0';
    file[0x2e] = '\0';
    file[0x2f] = '\0';
    file[0x10] = '\0';
    file[0x11] = '\0';
    file[0x12] = '\0';
    file[0x13] = '\0';
    file[0x14] = '\0';
    file[0x15] = '\0';
    file[0x16] = '\0';
    file[0x17] = '\0';
    file[0x18] = '\0';
    file[0x19] = '\0';
    file[0x1a] = '\0';
    file[0x1b] = '\0';
    file[0x1c] = '\0';
    file[0x1d] = '\0';
    file[0x1e] = '\0';
    file[0x1f] = '\0';
    file[0] = '\0';
    file[1] = '\0';
    file[2] = '\0';
    file[3] = '\0';
    file[4] = '\0';
    file[5] = '\0';
    file[6] = '\0';
    file[7] = '\0';
    file[8] = '\0';
    file[9] = '\0';
    file[10] = '\0';
    file[0xb] = '\0';
    file[0xc] = '\0';
    file[0xd] = '\0';
    file[0xe] = '\0';
    file[0xf] = '\0';
    file[0x60] = '\0';
    file[0x61] = '\0';
    file[0x62] = '\0';
    file[99] = '\0';
    str_split(chmod_arg,perms,file,' ');
    if (file[0] == '\0') {
      text = "SITE CHMOD needs 2 arguments.";
      iVar1 = 500;
    }
    else {
      __mode = str_octal_to_uint(perms);
      iVar1 = chmod(file,__mode);
      if (iVar1 < 0) {
        text = "SITE CHMOD failed.";
        iVar1 = 0x1f8;
      }
      else {
        text = "SITE CHMOD ok.";
        iVar1 = 200;
      }
    }
    ftp_relply(sess,iVar1,text);
    return;
  }
  ftp_relply(sess,500,"SITE CHMOD needs 2 arguments.");
  return;
}

Assistant:

void do_site_chmod(session_t *sess, char *chmod_arg) {
  // chmod <param> <file>
  if (strlen(chmod_arg) == 0) {
    ftp_relply(sess, FTP_BADCMD, "SITE CHMOD needs 2 arguments.");
    return;
  }
  char perms[100] = {0};
  char file[100] = {0};

  str_split(chmod_arg, perms, file, ' ');
  if (strlen(file) == 0) {
    ftp_relply(sess, FTP_BADCMD, "SITE CHMOD needs 2 arguments.");
    return;
  }

  unsigned int mode = str_octal_to_uint(perms);
  if (chmod(file, mode) < 0) {
    ftp_relply(sess, FTP_BADMODE, "SITE CHMOD failed.");
  } else {
    ftp_relply(sess, FTP_CHMODOK, "SITE CHMOD ok.");
  }
}